

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_intrinsic_sse4.h
# Opt level: O1

uint aom_obmc_variance4x16_sse4_1(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  uVar2 = 0xfffffffffffffffc;
  auVar6 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar4 = (undefined1  [16])0x0;
  auVar5 = (undefined1  [16])0x0;
  do {
    auVar7 = pmovzxbd(in_XMM3,*(undefined4 *)pre);
    piVar1 = wsrc + uVar2 + 4;
    auVar7 = pmaddwd(auVar7,*(undefined1 (*) [16])(mask + uVar2 + 4));
    iVar9 = *piVar1 - auVar7._0_4_;
    iVar10 = piVar1[1] - auVar7._4_4_;
    iVar11 = piVar1[2] - auVar7._8_4_;
    iVar12 = piVar1[3] - auVar7._12_4_;
    auVar8._0_4_ = (iVar9 >> 0x1f) + iVar9 + auVar6._0_4_ >> 0xc;
    auVar8._4_4_ = (iVar10 >> 0x1f) + iVar10 + auVar6._4_4_ >> 0xc;
    auVar8._8_4_ = (iVar11 >> 0x1f) + iVar11 + auVar6._8_4_ >> 0xc;
    auVar8._12_4_ = (iVar12 >> 0x1f) + iVar12 + auVar6._12_4_ >> 0xc;
    auVar3._0_4_ = auVar5._0_4_ + auVar8._0_4_;
    auVar3._4_4_ = auVar5._4_4_ + auVar8._4_4_;
    auVar3._8_4_ = auVar5._8_4_ + auVar8._8_4_;
    auVar3._12_4_ = auVar5._12_4_ + auVar8._12_4_;
    in_XMM3 = pmulld(auVar8,auVar8);
    auVar7._0_4_ = auVar4._0_4_ + in_XMM3._0_4_;
    auVar7._4_4_ = auVar4._4_4_ + in_XMM3._4_4_;
    auVar7._8_4_ = auVar4._8_4_ + in_XMM3._8_4_;
    auVar7._12_4_ = auVar4._12_4_ + in_XMM3._12_4_;
    uVar2 = uVar2 + 4;
    pre = pre + (long)(pre_stride + -4) + 4;
    auVar4 = auVar7;
    auVar5 = auVar3;
  } while (uVar2 < 0x3c);
  auVar4 = phaddd(auVar3,auVar3);
  auVar5 = phaddd(auVar4,auVar4);
  auVar4 = phaddd(auVar7,auVar7);
  auVar4 = phaddd(auVar4,auVar4);
  *sse = auVar4._0_4_;
  return auVar4._0_4_ - (int)((ulong)((long)auVar5._0_4_ * (long)auVar5._0_4_) >> 6);
}

Assistant:

static inline void obmc_variance_w4(const uint8_t *pre, const int pre_stride,
                                    const int32_t *wsrc, const int32_t *mask,
                                    unsigned int *const sse, int *const sum,
                                    const int h) {
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_b = xx_loadl_32(pre + n);
    const __m128i v_m_d = _mm_load_si128((const __m128i *)(mask + n));
    const __m128i v_w_d = _mm_load_si128((const __m128i *)(wsrc + n));

    const __m128i v_p_d = _mm_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}